

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void showCountries(vector<Map::Country_*,_std::allocator<Map::Country_*>_> countries)

{
  long lVar1;
  long *plVar2;
  ostream *poVar3;
  long *plVar4;
  Country **neighbour;
  long *plVar5;
  long *in_RSI;
  long *in_RDI;
  long *local_60;
  long local_58;
  long local_50 [2];
  long *local_40;
  long *local_38;
  
  if (in_RDI != in_RSI) {
    local_40 = in_RSI;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"You own: ",9);
      lVar1 = **(long **)(*in_RDI + 8);
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,lVar1,(*(long **)(*in_RDI + 8))[1] + lVar1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_60,local_58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," with ",6);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,**(int **)(*in_RDI + 0x20));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," armies.",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_60 != local_50) {
        operator_delete(local_60,local_50[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tNeighbours: ",0xd)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      plVar2 = (long *)(*(undefined8 **)(*in_RDI + 0x28))[1];
      local_38 = in_RDI;
      for (plVar5 = (long *)**(undefined8 **)(*in_RDI + 0x28); plVar5 != plVar2; plVar5 = plVar5 + 1
          ) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tName: ",8);
        lVar1 = **(long **)(*plVar5 + 8);
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,lVar1,(*(long **)(*plVar5 + 8))[1] + lVar1);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_60,local_58);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," Armies: ",9);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,**(int **)(*plVar5 + 0x20));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," Owned by: Player ",0x12);
        plVar4 = (long *)std::ostream::operator<<(poVar3,**(int **)(*plVar5 + 0x18));
        std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
        std::ostream::put((char)plVar4);
        std::ostream::flush();
        if (local_60 != local_50) {
          operator_delete(local_60,local_50[0] + 1);
        }
      }
      in_RDI = local_38 + 1;
    } while (in_RDI != local_40);
  }
  return;
}

Assistant:

static void showCountries(std::vector<Map::Country *> countries) {
    for (auto &country: countries) {
        std::cout << "You own: " << country->getCountryName() << " with " << country->getNumberOfTroops() << " armies."
                  << std::endl;
        std::cout << "\tNeighbours: " << std::endl;
        for (auto &neighbour: *country->getAdjCountries()) {
            std::cout << "\t\tName: " << neighbour->getCountryName() << " Armies: " << neighbour->getNumberOfTroops()
                      << " Owned by: Player " << neighbour->getPlayerOwnerID() << std::endl;
        }
    }
}